

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

void __thiscall
TPZMatrix<std::complex<long_double>_>::AddKel
          (TPZMatrix<std::complex<long_double>_> *this,TPZFMatrix<std::complex<long_double>_> *elmat
          ,TPZVec<long> *source,TPZVec<long> *destinationindex)

{
  long lVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  longdouble lVar7;
  longdouble lVar8;
  complex<long_double> prevval;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined2 uStack_80;
  undefined2 uStack_7e;
  undefined4 uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined2 uStack_70;
  undefined2 uStack_6e;
  undefined4 uStack_6c;
  long local_68;
  long local_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  lVar4 = source->fNElements;
  lVar7 = (longdouble)0;
  local_88 = SUB104(lVar7,0);
  uStack_84 = (undefined4)((unkuint10)lVar7 >> 0x20);
  uStack_80 = (undefined2)((unkuint10)lVar7 >> 0x40);
  local_78 = local_88;
  uStack_74 = uStack_84;
  uStack_70 = uStack_80;
  iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x10])();
  local_60 = lVar4;
  if (iVar3 == 0) {
    if (0 < lVar4) {
      local_68 = 0;
      do {
        lVar4 = destinationindex->fStore[local_68];
        lVar1 = source->fStore[local_68];
        lVar6 = 0;
        do {
          lVar2 = destinationindex->fStore[lVar6];
          lVar5 = source->fStore[lVar6];
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (&local_58,this,lVar4,lVar2);
          local_78 = local_48;
          uStack_74 = uStack_44;
          uStack_70 = (undefined2)uStack_40;
          uStack_6e = (undefined2)((uint)uStack_40 >> 0x10);
          uStack_6c = uStack_3c;
          local_88 = local_58;
          uStack_84 = uStack_54;
          uStack_80 = (undefined2)uStack_50;
          uStack_7e = (undefined2)((uint)uStack_50 >> 0x10);
          uStack_7c = uStack_4c;
          if ((((lVar1 < 0) ||
               ((elmat->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow <=
                lVar1)) || (lVar5 < 0)) ||
             ((elmat->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol <= lVar5
             )) {
            TPZFMatrix<std::complex<long_double>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar5 = lVar5 * (elmat->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.
                          fRow;
          lVar8 = (longdouble)CONCAT28(uStack_80,CONCAT44(uStack_54,local_58)) +
                  *(longdouble *)elmat->fElem[lVar5 + lVar1]._M_value;
          lVar7 = (longdouble)CONCAT28(uStack_70,CONCAT44(uStack_44,local_48)) +
                  *(longdouble *)(elmat->fElem[lVar5 + lVar1]._M_value + 0x10);
          local_88 = SUB104(lVar8,0);
          uStack_84 = (undefined4)((unkuint10)lVar8 >> 0x20);
          uStack_80 = (undefined2)((unkuint10)lVar8 >> 0x40);
          local_78 = SUB104(lVar7,0);
          uStack_74 = (undefined4)((unkuint10)lVar7 >> 0x20);
          uStack_70 = (undefined2)((unkuint10)lVar7 >> 0x40);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,lVar4,lVar2,&local_88);
          lVar6 = lVar6 + 1;
        } while (local_60 != lVar6);
        local_68 = local_68 + 1;
      } while (local_68 != local_60);
    }
  }
  else if (0 < lVar4) {
    lVar4 = 0;
    do {
      lVar1 = destinationindex->fStore[lVar4];
      lVar6 = source->fStore[lVar4];
      local_68 = lVar4;
      do {
        lVar2 = destinationindex->fStore[lVar4];
        lVar5 = source->fStore[lVar4];
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (&local_58,this,lVar1,lVar2);
        local_78 = local_48;
        uStack_74 = uStack_44;
        uStack_70 = (undefined2)uStack_40;
        uStack_6e = (undefined2)((uint)uStack_40 >> 0x10);
        uStack_6c = uStack_3c;
        local_88 = local_58;
        uStack_84 = uStack_54;
        uStack_80 = (undefined2)uStack_50;
        uStack_7e = (undefined2)((uint)uStack_50 >> 0x10);
        uStack_7c = uStack_4c;
        if (((lVar6 < 0) ||
            ((elmat->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow <= lVar6)
            ) || ((lVar5 < 0 ||
                  ((elmat->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol <=
                   lVar5)))) {
          TPZFMatrix<std::complex<long_double>_>::Error
                    ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar5 = lVar5 * (elmat->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.
                        fRow;
        lVar8 = (longdouble)CONCAT28(uStack_80,CONCAT44(uStack_54,local_58)) +
                *(longdouble *)elmat->fElem[lVar5 + lVar6]._M_value;
        lVar7 = (longdouble)CONCAT28(uStack_70,CONCAT44(uStack_44,local_48)) +
                *(longdouble *)(elmat->fElem[lVar5 + lVar6]._M_value + 0x10);
        local_88 = SUB104(lVar8,0);
        uStack_84 = (undefined4)((unkuint10)lVar8 >> 0x20);
        uStack_80 = (undefined2)((unkuint10)lVar8 >> 0x40);
        local_78 = SUB104(lVar7,0);
        uStack_74 = (undefined4)((unkuint10)lVar7 >> 0x20);
        uStack_70 = (undefined2)((unkuint10)lVar7 >> 0x40);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar1,lVar2,&local_88);
        lVar4 = lVar4 + 1;
      } while (lVar4 < local_60);
      lVar4 = local_68 + 1;
    } while (lVar4 != local_60);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::AddKel(TPZFMatrix<TVar> &elmat, TPZVec<int64_t> &source, TPZVec<int64_t> &destinationindex) {
	
	int64_t nelem = source.NElements();
  	int64_t icoef,jcoef,ieq,jeq,ieqs,jeqs;
    TVar prevval;
	if(IsSymmetric()) {
		for(icoef=0; icoef<nelem; icoef++) {
			ieq = destinationindex[icoef];
			ieqs = source[icoef];
			for(jcoef=icoef; jcoef<nelem; jcoef++) {
				jeq = destinationindex[jcoef];
				jeqs = source[jcoef];
				prevval = GetVal(ieq,jeq);
				prevval += elmat(ieqs,jeqs);
				PutVal(ieq,jeq,prevval);
			}
		}
	} else {
		for(icoef=0; icoef<nelem; icoef++) {
			ieq = destinationindex[icoef];
			ieqs = source[icoef];
			for(jcoef=0; jcoef<nelem; jcoef++) {
				jeq = destinationindex[jcoef];
				jeqs = source[jcoef];
				prevval = GetVal(ieq,jeq);
				prevval += elmat(ieqs,jeqs);
				PutVal(ieq,jeq,prevval);
			}
		}
	}
}